

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

int getID(InternalInstruction *insn)

{
  byte bVar1;
  _Bool _Var2;
  int iVar3;
  InstructionSpecifier *pIVar4;
  ushort uVar5;
  InstructionSpecifier *specWithNewOpcode;
  InstructionSpecifier *pIStack_40;
  uint16_t instructionIDWithNewOpcode;
  InstructionSpecifier *spec_2;
  InstructionSpecifier *pIStack_30;
  uint16_t instructionIDWithOpsize;
  InstructionSpecifier *spec_1;
  InstructionSpecifier *spec;
  uint16_t instructionID;
  InternalInstruction *pIStack_18;
  uint16_t attrMask;
  InternalInstruction *insn_local;
  
  spec._6_2_ = (ushort)(insn->mode == MODE_64BIT);
  pIStack_18 = insn;
  if (insn->vectorExtensionType == TYPE_NO_VEX_XOP) {
    if ((insn->mode == MODE_16BIT) ||
       (_Var2 = isPrefixAtLocation(insn,'f',insn->necessaryPrefixLocation), !_Var2)) {
      _Var2 = isPrefixAtLocation(pIStack_18,'g',pIStack_18->necessaryPrefixLocation);
      if (_Var2) {
        spec._6_2_ = spec._6_2_ | 0x20;
      }
      else {
        _Var2 = isPrefixAtLocation(pIStack_18,0xf3,pIStack_18->necessaryPrefixLocation);
        if (_Var2) {
          spec._6_2_ = spec._6_2_ | 2;
        }
        else {
          _Var2 = isPrefixAtLocation(pIStack_18,0xf2,pIStack_18->necessaryPrefixLocation);
          if (_Var2) {
            spec._6_2_ = spec._6_2_ | 4;
          }
        }
      }
    }
    else {
      spec._6_2_ = spec._6_2_ | 0x10;
    }
  }
  else {
    uVar5 = 0x40;
    if (insn->vectorExtensionType == TYPE_EVEX) {
      uVar5 = 0x100;
    }
    spec._6_2_ = spec._6_2_ | uVar5;
    if (insn->vectorExtensionType == TYPE_EVEX) {
      bVar1 = insn->vectorExtensionPrefix[2] & 3;
      if (bVar1 == 1) {
        spec._6_2_ = spec._6_2_ | 0x10;
      }
      else if (bVar1 == 2) {
        spec._6_2_ = spec._6_2_ | 2;
      }
      else if (bVar1 == 3) {
        spec._6_2_ = spec._6_2_ | 4;
      }
      if ((int)(insn->vectorExtensionPrefix[3] & 0x80) >> 7 != 0) {
        spec._6_2_ = spec._6_2_ | 0x1000;
      }
      if ((int)(insn->vectorExtensionPrefix[3] & 0x10) >> 4 != 0) {
        spec._6_2_ = spec._6_2_ | 0x2000;
      }
      if ((insn->vectorExtensionPrefix[3] & 7) != 0) {
        spec._6_2_ = spec._6_2_ | 0x800;
      }
      if ((int)(insn->vectorExtensionPrefix[3] & 0x20) >> 5 != 0) {
        spec._6_2_ = spec._6_2_ | 0x200;
      }
      if ((int)(insn->vectorExtensionPrefix[3] & 0x40) >> 6 != 0) {
        spec._6_2_ = spec._6_2_ | 0x400;
      }
    }
    else if (insn->vectorExtensionType == TYPE_VEX_3B) {
      bVar1 = insn->vectorExtensionPrefix[2] & 3;
      if (bVar1 == 1) {
        spec._6_2_ = spec._6_2_ | 0x10;
      }
      else if (bVar1 == 2) {
        spec._6_2_ = spec._6_2_ | 2;
      }
      else if (bVar1 == 3) {
        spec._6_2_ = spec._6_2_ | 4;
      }
      if ((int)(insn->vectorExtensionPrefix[2] & 4) >> 2 != 0) {
        spec._6_2_ = spec._6_2_ | 0x80;
      }
    }
    else if (insn->vectorExtensionType == TYPE_VEX_2B) {
      bVar1 = insn->vectorExtensionPrefix[1] & 3;
      if (bVar1 == 1) {
        spec._6_2_ = spec._6_2_ | 0x10;
      }
      else if (bVar1 == 2) {
        spec._6_2_ = spec._6_2_ | 2;
      }
      else if (bVar1 == 3) {
        spec._6_2_ = spec._6_2_ | 4;
      }
      if ((int)(insn->vectorExtensionPrefix[1] & 4) >> 2 != 0) {
        spec._6_2_ = spec._6_2_ | 0x80;
      }
    }
    else {
      if (insn->vectorExtensionType != TYPE_XOP) {
        return -1;
      }
      bVar1 = insn->vectorExtensionPrefix[2] & 3;
      if (bVar1 == 1) {
        spec._6_2_ = spec._6_2_ | 0x10;
      }
      else if (bVar1 == 2) {
        spec._6_2_ = spec._6_2_ | 2;
      }
      else if (bVar1 == 3) {
        spec._6_2_ = spec._6_2_ | 4;
      }
      if ((int)(insn->vectorExtensionPrefix[2] & 4) >> 2 != 0) {
        spec._6_2_ = spec._6_2_ | 0x80;
      }
    }
  }
  if ((pIStack_18->rexPrefix & 8) != 0) {
    spec._6_2_ = spec._6_2_ | 8;
  }
  iVar3 = getIDWithAttrMask((uint16_t *)((long)&spec + 4),pIStack_18,spec._6_2_);
  if (iVar3 == 0) {
    if (((pIStack_18->mode == MODE_16BIT) && (pIStack_18->opcode == 0xe3)) &&
       (spec_1 = specifierForUID(spec._4_2_), x86OperandSets[spec_1->operands][0].type == '\x01')) {
      spec._6_2_ = spec._6_2_ ^ 0x20;
      iVar3 = getIDWithAttrMask((uint16_t *)((long)&spec + 4),pIStack_18,spec._6_2_);
      if (iVar3 != 0) {
        return -1;
      }
    }
    if (((pIStack_18->mode == MODE_16BIT) || ((pIStack_18->isPrefix66 & 1U) != 0)) &&
       ((spec._6_2_ & 0x10) == 0)) {
      pIStack_30 = specifierForUID(spec._4_2_);
      iVar3 = getIDWithAttrMask((uint16_t *)((long)&spec_2 + 6),pIStack_18,spec._6_2_ | 0x10);
      if (iVar3 == 0) {
        _Var2 = is16BitEquivalent((uint)spec._4_2_,(uint)spec_2._6_2_);
        if ((_Var2) && ((pIStack_18->mode == MODE_16BIT) != (bool)(pIStack_18->isPrefix66 & 1U))) {
          pIStack_18->instructionID = spec_2._6_2_;
          pIVar4 = specifierForUID(spec_2._6_2_);
          pIStack_18->spec = pIVar4;
        }
        else {
          pIStack_18->instructionID = spec._4_2_;
          pIStack_18->spec = pIStack_30;
        }
        insn_local._4_4_ = 0;
      }
      else {
        pIStack_18->instructionID = spec._4_2_;
        pIStack_18->spec = pIStack_30;
        insn_local._4_4_ = 0;
      }
    }
    else if (((pIStack_18->opcodeType == ONEBYTE) && (pIStack_18->opcode == 0x90)) &&
            ((pIStack_18->rexPrefix & 1) != 0)) {
      pIStack_40 = specifierForUID(spec._4_2_);
      pIStack_18->opcode = 0x91;
      iVar3 = getIDWithAttrMask((uint16_t *)((long)&specWithNewOpcode + 6),pIStack_18,spec._6_2_);
      if (iVar3 == 0) {
        pIVar4 = specifierForUID(specWithNewOpcode._6_2_);
        pIStack_18->opcode = 0x90;
        pIStack_18->instructionID = specWithNewOpcode._6_2_;
        pIStack_18->spec = pIVar4;
        insn_local._4_4_ = 0;
      }
      else {
        pIStack_18->opcode = 0x90;
        pIStack_18->instructionID = spec._4_2_;
        pIStack_18->spec = pIStack_40;
        insn_local._4_4_ = 0;
      }
    }
    else {
      pIStack_18->instructionID = spec._4_2_;
      pIVar4 = specifierForUID(pIStack_18->instructionID);
      pIStack_18->spec = pIVar4;
      insn_local._4_4_ = 0;
    }
  }
  else {
    insn_local._4_4_ = -1;
  }
  return insn_local._4_4_;
}

Assistant:

static int getID(struct InternalInstruction *insn)
{
	uint16_t attrMask;
	uint16_t instructionID;
	const struct InstructionSpecifier *spec;

	// printf(">>> getID()\n");
	attrMask = ATTR_NONE;

	if (insn->mode == MODE_64BIT)
		attrMask |= ATTR_64BIT;

	if (insn->vectorExtensionType != TYPE_NO_VEX_XOP) {
		attrMask |= (insn->vectorExtensionType == TYPE_EVEX) ? ATTR_EVEX : ATTR_VEX;

		if (insn->vectorExtensionType == TYPE_EVEX) {
			switch (ppFromEVEX3of4(insn->vectorExtensionPrefix[2])) {
				case VEX_PREFIX_66:
					attrMask |= ATTR_OPSIZE;
					break;
				case VEX_PREFIX_F3:
					attrMask |= ATTR_XS;
					break;
				case VEX_PREFIX_F2:
					attrMask |= ATTR_XD;
					break;
			}

			if (zFromEVEX4of4(insn->vectorExtensionPrefix[3]))
				attrMask |= ATTR_EVEXKZ;
			if (bFromEVEX4of4(insn->vectorExtensionPrefix[3]))
				attrMask |= ATTR_EVEXB;
			if (aaaFromEVEX4of4(insn->vectorExtensionPrefix[3]))
				attrMask |= ATTR_EVEXK;
			if (lFromEVEX4of4(insn->vectorExtensionPrefix[3]))
				attrMask |= ATTR_EVEXL;
			if (l2FromEVEX4of4(insn->vectorExtensionPrefix[3]))
				attrMask |= ATTR_EVEXL2;
		} else if (insn->vectorExtensionType == TYPE_VEX_3B) {
			switch (ppFromVEX3of3(insn->vectorExtensionPrefix[2])) {
				case VEX_PREFIX_66:
					attrMask |= ATTR_OPSIZE;
					break;
				case VEX_PREFIX_F3:
					attrMask |= ATTR_XS;
					break;
				case VEX_PREFIX_F2:
					attrMask |= ATTR_XD;
					break;
			}

			if (lFromVEX3of3(insn->vectorExtensionPrefix[2]))
				attrMask |= ATTR_VEXL;
		} else if (insn->vectorExtensionType == TYPE_VEX_2B) {
			switch (ppFromVEX2of2(insn->vectorExtensionPrefix[1])) {
				case VEX_PREFIX_66:
					attrMask |= ATTR_OPSIZE;
					break;
				case VEX_PREFIX_F3:
					attrMask |= ATTR_XS;
					break;
				case VEX_PREFIX_F2:
					attrMask |= ATTR_XD;
					break;
			}

			if (lFromVEX2of2(insn->vectorExtensionPrefix[1]))
				attrMask |= ATTR_VEXL;
		} else if (insn->vectorExtensionType == TYPE_XOP) {
			switch (ppFromXOP3of3(insn->vectorExtensionPrefix[2])) {
				case VEX_PREFIX_66:
					attrMask |= ATTR_OPSIZE;
					break;
				case VEX_PREFIX_F3:
					attrMask |= ATTR_XS;
					break;
				case VEX_PREFIX_F2:
					attrMask |= ATTR_XD;
					break;
			}

			if (lFromXOP3of3(insn->vectorExtensionPrefix[2]))
				attrMask |= ATTR_VEXL;
		} else {
			return -1;
		}
	} else {
		if (insn->mode != MODE_16BIT && isPrefixAtLocation(insn, 0x66, insn->necessaryPrefixLocation)) {
			attrMask |= ATTR_OPSIZE;
		} else if (isPrefixAtLocation(insn, 0x67, insn->necessaryPrefixLocation)) {
			attrMask |= ATTR_ADSIZE;
		} else if (isPrefixAtLocation(insn, 0xf3, insn->necessaryPrefixLocation)) {
			attrMask |= ATTR_XS;
		} else if (isPrefixAtLocation(insn, 0xf2, insn->necessaryPrefixLocation)) {
			attrMask |= ATTR_XD;
		}
	}

	if (insn->rexPrefix & 0x08)
		attrMask |= ATTR_REXW;

	if (getIDWithAttrMask(&instructionID, insn, attrMask))
		return -1;

	/*
	 * JCXZ/JECXZ need special handling for 16-bit mode because the meaning
	 * of the AdSize prefix is inverted w.r.t. 32-bit mode.
	 */
	if (insn->mode == MODE_16BIT && insn->opcode == 0xE3) {
		spec = specifierForUID(instructionID);

		/*
		 * Check for Ii8PCRel instructions. We could alternatively do a
		 * string-compare on the names, but this is probably cheaper.
		 */
		if (x86OperandSets[spec->operands][0].type == TYPE_REL8) {
			attrMask ^= ATTR_ADSIZE;
			if (getIDWithAttrMask(&instructionID, insn, attrMask))
				return -1;
		}
	}

	/* The following clauses compensate for limitations of the tables. */
	if ((insn->mode == MODE_16BIT || insn->isPrefix66) &&
			!(attrMask & ATTR_OPSIZE)) {
		/*
		 * The instruction tables make no distinction between instructions that
		 * allow OpSize anywhere (i.e., 16-bit operations) and that need it in a
		 * particular spot (i.e., many MMX operations).  In general we're
		 * conservative, but in the specific case where OpSize is present but not
		 * in the right place we check if there's a 16-bit operation.
		 */

		const struct InstructionSpecifier *spec;
		uint16_t instructionIDWithOpsize;

		spec = specifierForUID(instructionID);

		if (getIDWithAttrMask(&instructionIDWithOpsize,
					insn, attrMask | ATTR_OPSIZE)) {
			/*
			 * ModRM required with OpSize but not present; give up and return version
			 * without OpSize set
			 */

			insn->instructionID = instructionID;
			insn->spec = spec;
			return 0;
		}

		if (is16BitEquivalent(instructionID, instructionIDWithOpsize) &&
				(insn->mode == MODE_16BIT) ^ insn->isPrefix66) {
			insn->instructionID = instructionIDWithOpsize;
			insn->spec = specifierForUID(instructionIDWithOpsize);
		} else {
			insn->instructionID = instructionID;
			insn->spec = spec;
		}
		return 0;
	}

	if (insn->opcodeType == ONEBYTE && insn->opcode == 0x90 &&
			insn->rexPrefix & 0x01) {
		/*
		 * NOOP shouldn't decode as NOOP if REX.b is set. Instead
		 * it should decode as XCHG %r8, %eax.
		 */

		const struct InstructionSpecifier *spec;
		uint16_t instructionIDWithNewOpcode;
		const struct InstructionSpecifier *specWithNewOpcode;

		spec = specifierForUID(instructionID);

		/* Borrow opcode from one of the other XCHGar opcodes */
		insn->opcode = 0x91;

		if (getIDWithAttrMask(&instructionIDWithNewOpcode,
					insn,
					attrMask)) {
			insn->opcode = 0x90;

			insn->instructionID = instructionID;
			insn->spec = spec;
			return 0;
		}

		specWithNewOpcode = specifierForUID(instructionIDWithNewOpcode);

		/* Change back */
		insn->opcode = 0x90;

		insn->instructionID = instructionIDWithNewOpcode;
		insn->spec = specWithNewOpcode;

		return 0;
	}

	insn->instructionID = instructionID;
	insn->spec = specifierForUID(insn->instructionID);

	return 0;
}